

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Thread::Mark(Thread *this)

{
  pointer pFVar1;
  uint *puVar2;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *__range2;
  Frame *frame;
  pointer this_00;
  uint *puVar3;
  
  pFVar1 = (this->frames_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->frames_).
                 super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pFVar1; this_00 = this_00 + 1)
  {
    Frame::Mark(this_00,this->store_);
  }
  puVar2 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    Store::Mark(this->store_,
                (Ref)(this->values_).
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_start[*puVar3].field_0.ref_.index);
  }
  Store::Mark(this->store_,&this->exceptions_);
  return;
}

Assistant:

void Thread::Mark() {
  for (auto&& frame : frames_) {
    frame.Mark(store_);
  }
  for (auto index : refs_) {
    store_.Mark(values_[index].Get<Ref>());
  }
  store_.Mark(exceptions_);
}